

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_int>::aabbTest
          (btAxisSweep3Internal<unsigned_int> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          btBroadphaseAabbCallback *callback)

{
  btScalar *pbVar1;
  btVector3 *pbVar2;
  float fVar3;
  uint uVar4;
  btDbvtBroadphase *pbVar5;
  Handle *pHVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  
  pbVar5 = this->m_raycastAccelerator;
  if (pbVar5 != (btDbvtBroadphase *)0x0) {
    (*(pbVar5->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[7])
              (pbVar5,aabbMin,aabbMax,callback);
    return;
  }
  if ((this->m_numHandles & 0x7fffffff) != 0) {
    uVar9 = 0;
    do {
      if ((this->m_pEdges[0][uVar9 + 1].m_pos & 1) != 0) {
        uVar4 = this->m_pEdges[0][uVar9 + 1].m_handle;
        pHVar6 = this->m_pHandles;
        pbVar2 = &pHVar6[uVar4].super_btBroadphaseProxy.m_aabbMax;
        bVar8 = true;
        if ((aabbMin->m_floats[0] < pbVar2->m_floats[0] ||
             aabbMin->m_floats[0] == pbVar2->m_floats[0]) &&
           (fVar3 = pHVar6[uVar4].super_btBroadphaseProxy.m_aabbMin.m_floats[0], bVar8 = true,
           fVar3 < aabbMax->m_floats[0] || fVar3 == aabbMax->m_floats[0])) {
          bVar8 = false;
        }
        pbVar1 = pHVar6[uVar4].super_btBroadphaseProxy.m_aabbMax.m_floats + 2;
        bVar7 = true;
        if ((aabbMin->m_floats[2] < *pbVar1 || aabbMin->m_floats[2] == *pbVar1) &&
           (fVar3 = pHVar6[uVar4].super_btBroadphaseProxy.m_aabbMin.m_floats[2],
           fVar3 < aabbMax->m_floats[2] || fVar3 == aabbMax->m_floats[2])) {
          bVar7 = bVar8;
        }
        pbVar1 = pHVar6[uVar4].super_btBroadphaseProxy.m_aabbMax.m_floats + 1;
        if (aabbMin->m_floats[1] < *pbVar1 || aabbMin->m_floats[1] == *pbVar1) {
          fVar3 = pHVar6[uVar4].super_btBroadphaseProxy.m_aabbMin.m_floats[1];
          if (!bVar7 && (fVar3 < aabbMax->m_floats[1] || fVar3 == aabbMax->m_floats[1])) {
            (*callback->_vptr_btBroadphaseAabbCallback[2])(callback);
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->m_numHandles * 2);
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::aabbTest(const btVector3& aabbMin, const btVector3& aabbMax, btBroadphaseAabbCallback& callback)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->aabbTest(aabbMin,aabbMax,callback);
	} else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i=1;i<m_numHandles*2+1;i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				Handle* handle = getHandle(m_pEdges[axis][i].m_handle);
				if (TestAabbAgainstAabb2(aabbMin,aabbMax,handle->m_aabbMin,handle->m_aabbMax))
				{
					callback.process(handle);
				}
			}
		}
	}
}